

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

Statement *
slang::ast::ForeachLoopStatement::fromSyntax
          (Compilation *compilation,ForeachLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  uint uVar1;
  ForeachLoopListSyntax *pFVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  ForeachLoopStatementSyntax *this;
  Compilation *compilation_00;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  specific_symbol_iterator<slang::ast::IteratorSymbol> sVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  Type *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ForeachLoopStatement *stmt;
  EVP_PKEY_CTX *src;
  ulong uVar8;
  ulong uVar9;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_(std::ranges::subrange_kind)0>
  sVar10;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  _Storage<slang::ConstantRange,_true> local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined8 local_e0;
  Expression *local_d8;
  ForeachLoopStatementSyntax *local_d0;
  Compilation *local_c8;
  ASTContext *local_c0;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> local_b8 [2];
  SourceRange local_40;
  
  uVar1 = (stmtCtx->flags).m_bits;
  (stmtCtx->flags).m_bits = uVar1 | 1;
  iVar5 = Expression::bind((int)(((syntax->loopList).ptr)->arrayName).ptr,(sockaddr *)context,0);
  local_d8 = (Expression *)CONCAT44(extraout_var,iVar5);
  local_b8[0].data_ = (pointer)local_b8[0].firstElement;
  local_b8[0].len = 0;
  local_b8[0].cap = 4;
  this_00 = (local_d8->type).ptr;
  local_c8 = compilation;
  local_c0 = context;
  sVar10 = Scope::membersOfType<slang::ast::IteratorSymbol>((context->scope).ptr);
  sVar6 = sVar10._M_begin.current;
  pFVar2 = (syntax->loopList).ptr;
  uVar9 = (pFVar2->loopVariables).elements._M_extent._M_extent_value + 1;
  local_d0 = syntax;
  if (1 < uVar9) {
    uVar8 = 0;
    do {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((pFVar2->loopVariables).elements._M_ptr + uVar8 * 2));
      pSVar3 = *ppSVar7;
      bVar4 = Type::hasFixedRange(this_00);
      if (bVar4) {
        local_f0._M_value = Type::getFixedRange(this_00);
        _local_e8 = CONCAT71(uStack_e7,1);
        local_e0 = 0;
        SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
        emplace_back<slang::ast::ForeachLoopStatement::LoopDim>
                  (local_b8,(LoopDim *)&local_f0._M_value);
      }
      else {
        SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplace_back<>(local_b8);
      }
      this_00 = Type::getArrayElementType(this_00);
      if (pSVar3->kind != EmptyIdentifierName) {
        local_b8[0].data_[local_b8[0].len - 1].loopVar = (IteratorSymbol *)sVar6.current;
        do {
          sVar6.current =
               (((IteratorSymbol *)sVar6.current)->super_TempVarSymbol).super_VariableSymbol.
               super_ValueSymbol.super_Symbol.nextInScope;
          if ((IteratorSymbol *)sVar6.current == (IteratorSymbol *)0x0) break;
        } while ((((IteratorSymbol *)sVar6.current)->super_TempVarSymbol).super_VariableSymbol.
                 super_ValueSymbol.super_Symbol.kind != Iterator);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9 >> 1);
  }
  this = local_d0;
  iVar5 = Statement::bind((int)(local_d0->statement).ptr,(sockaddr *)local_c0,(socklen_t)stmtCtx);
  compilation_00 = local_c8;
  local_f0._0_4_ =
       SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::copy
                 (local_b8,(EVP_PKEY_CTX *)local_c8,src);
  local_f0._M_value.right = extraout_var_01;
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this);
  stmt = BumpAllocator::
         emplace<slang::ast::ForeachLoopStatement,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation_00->super_BumpAllocator,local_d8,
                    (span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *)
                    &local_f0._M_value,(Statement *)CONCAT44(extraout_var_00,iVar5),&local_40);
  if (((Statement *)CONCAT44(extraout_var_00,iVar5))->kind == Invalid) {
    stmt = (ForeachLoopStatement *)Statement::badStmt(compilation_00,&stmt->super_Statement);
  }
  if (local_b8[0].data_ != (pointer)local_b8[0].firstElement) {
    operator_delete(local_b8[0].data_);
  }
  (stmtCtx->flags).m_bits = uVar1 & 9 | (stmtCtx->flags).m_bits & 0x16;
  return &stmt->super_Statement;
}

Assistant:

Statement& ForeachLoopStatement::fromSyntax(Compilation& compilation,
                                            const ForeachLoopStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    auto& arrayRef = Expression::bind(*syntax.loopList->arrayName, context);
    SLANG_ASSERT(!arrayRef.bad());

    // Loop variables were already built in the containing block when it was elaborated,
    // so we just have to find them and associate them with the correct dim ranges here.
    SmallVector<LoopDim, 4> dims;
    const Type* type = arrayRef.type;
    auto range = context.scope->membersOfType<IteratorSymbol>();
    auto itIt = range.begin();

    for (auto loopVar : syntax.loopList->loopVariables) {
        if (type->hasFixedRange())
            dims.push_back({type->getFixedRange()});
        else
            dims.emplace_back();

        type = type->getArrayElementType();

        if (loopVar->kind == SyntaxKind::EmptyIdentifierName)
            continue;

        SLANG_ASSERT(itIt != range.end());
        SLANG_ASSERT(itIt->name == loopVar->as<IdentifierNameSyntax>().identifier.valueText());

        IteratorSymbol* it = const_cast<IteratorSymbol*>(&*itIt);
        dims.back().loopVar = it;
        itIt++;
    }

    SLANG_ASSERT(itIt == range.end());

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<ForeachLoopStatement>(arrayRef, dims.copy(compilation),
                                                            bodyStmt, syntax.sourceRange());
    if (bodyStmt.bad())
        return badStmt(compilation, result);
    return *result;
}